

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextColored(ImVec4 *col,char *fmt,...)

{
  va_list args;
  char *in_stack_ffffffffffffff28;
  ImVec4 *in_stack_ffffffffffffff30;
  
  TextColoredV(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(__va_list_tag *)0x466326);
  return;
}

Assistant:

void ImGui::TextColored(const ImVec4& col, const char* fmt, ...)
{
    va_list args;
    va_start(args, fmt);
    TextColoredV(col, fmt, args);
    va_end(args);
}